

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency.hxx
# Opt level: O2

bool __thiscall
andres::graph::Adjacency<unsigned_long>::operator<
          (Adjacency<unsigned_long> *this,Adjacency<unsigned_long> *in)

{
  bool bVar1;
  
  bVar1 = true;
  if (in->vertex_ <= this->vertex_) {
    if (this->vertex_ != in->vertex_) {
      return false;
    }
    bVar1 = this->edge_ < in->edge_;
  }
  return bVar1;
}

Assistant:

inline bool
Adjacency<T>::operator<(
    const Adjacency<T>& in
) const {
    if(vertex_ < in.vertex_) {
        return true;
    }
    else if(vertex_ == in.vertex_) {
        return edge_ < in.edge_;
    }
    else {
        return false;
    }
}